

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterFlushPMA(VdbeSorter *pSorter)

{
  undefined4 uVar1;
  int iVar2;
  u8 *puVar3;
  void *pCtx;
  u8 *aMem;
  int iTest;
  int nWorker;
  SortSubtask *pTask;
  int i;
  int rc;
  VdbeSorter *pSorter_local;
  
  pTask._4_4_ = 0;
  _iTest = (SortSubtask *)0x0;
  iVar2 = pSorter->nTask - 1;
  pSorter->bUsePMA = '\x01';
  for (pTask._0_4_ = 0; (int)pTask < iVar2; pTask._0_4_ = (int)pTask + 1) {
    _iTest = pSorter->aTask + (int)((uint)pSorter->iPrev + (int)pTask + 1) % iVar2;
    if (_iTest->bDone != 0) {
      pTask._4_4_ = vdbeSorterJoinThread(_iTest);
    }
    if ((pTask._4_4_ != 0) || (_iTest->pThread == (SQLiteThread *)0x0)) break;
  }
  if (pTask._4_4_ == 0) {
    if ((int)pTask == iVar2) {
      pTask._4_4_ = vdbeSorterListToPMA(pSorter->aTask + iVar2,&pSorter->list);
    }
    else {
      puVar3 = (_iTest->list).aMemory;
      pSorter->iPrev = (u8)(((long)_iTest - (long)pSorter->aTask) / 0x68);
      (_iTest->list).pList = (pSorter->list).pList;
      (_iTest->list).aMemory = (pSorter->list).aMemory;
      uVar1 = *(undefined4 *)&(pSorter->list).field_0x14;
      (_iTest->list).szPMA = (pSorter->list).szPMA;
      *(undefined4 *)&(_iTest->list).field_0x14 = uVar1;
      (pSorter->list).pList = (SorterRecord *)0x0;
      (pSorter->list).szPMA = 0;
      if (puVar3 == (u8 *)0x0) {
        if ((pSorter->list).aMemory != (u8 *)0x0) {
          puVar3 = (u8 *)sqlite3Malloc((long)pSorter->nMemory);
          (pSorter->list).aMemory = puVar3;
          if ((pSorter->list).aMemory == (u8 *)0x0) {
            return 7;
          }
        }
      }
      else {
        (pSorter->list).aMemory = puVar3;
        iVar2 = sqlite3MallocSize(puVar3);
        pSorter->nMemory = iVar2;
      }
      pTask._4_4_ = vdbeSorterCreateThread(_iTest,vdbeSorterFlushThread,_iTest);
    }
  }
  return pTask._4_4_;
}

Assistant:

static int vdbeSorterFlushPMA(VdbeSorter *pSorter){
#if SQLITE_MAX_WORKER_THREADS==0
  pSorter->bUsePMA = 1;
  return vdbeSorterListToPMA(&pSorter->aTask[0], &pSorter->list);
#else
  int rc = SQLITE_OK;
  int i;
  SortSubtask *pTask = 0;    /* Thread context used to create new PMA */
  int nWorker = (pSorter->nTask-1);

  /* Set the flag to indicate that at least one PMA has been written. 
  ** Or will be, anyhow.  */
  pSorter->bUsePMA = 1;

  /* Select a sub-task to sort and flush the current list of in-memory
  ** records to disk. If the sorter is running in multi-threaded mode,
  ** round-robin between the first (pSorter->nTask-1) tasks. Except, if
  ** the background thread from a sub-tasks previous turn is still running,
  ** skip it. If the first (pSorter->nTask-1) sub-tasks are all still busy,
  ** fall back to using the final sub-task. The first (pSorter->nTask-1)
  ** sub-tasks are prefered as they use background threads - the final 
  ** sub-task uses the main thread. */
  for(i=0; i<nWorker; i++){
    int iTest = (pSorter->iPrev + i + 1) % nWorker;
    pTask = &pSorter->aTask[iTest];
    if( pTask->bDone ){
      rc = vdbeSorterJoinThread(pTask);
    }
    if( rc!=SQLITE_OK || pTask->pThread==0 ) break;
  }

  if( rc==SQLITE_OK ){
    if( i==nWorker ){
      /* Use the foreground thread for this operation */
      rc = vdbeSorterListToPMA(&pSorter->aTask[nWorker], &pSorter->list);
    }else{
      /* Launch a background thread for this operation */
      u8 *aMem = pTask->list.aMemory;
      void *pCtx = (void*)pTask;

      assert( pTask->pThread==0 && pTask->bDone==0 );
      assert( pTask->list.pList==0 );
      assert( pTask->list.aMemory==0 || pSorter->list.aMemory!=0 );

      pSorter->iPrev = (u8)(pTask - pSorter->aTask);
      pTask->list = pSorter->list;
      pSorter->list.pList = 0;
      pSorter->list.szPMA = 0;
      if( aMem ){
        pSorter->list.aMemory = aMem;
        pSorter->nMemory = sqlite3MallocSize(aMem);
      }else if( pSorter->list.aMemory ){
        pSorter->list.aMemory = sqlite3Malloc(pSorter->nMemory);
        if( !pSorter->list.aMemory ) return SQLITE_NOMEM_BKPT;
      }

      rc = vdbeSorterCreateThread(pTask, vdbeSorterFlushThread, pCtx);
    }
  }

  return rc;
#endif /* SQLITE_MAX_WORKER_THREADS!=0 */
}